

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::write_rle85(Fl_PostScript_Graphics_Driver *this,uchar b,void *data)

{
  int iVar1;
  undefined8 in_RAX;
  uchar c;
  undefined8 uStack_28;
  
  iVar1 = *(int *)((long)data + 0x8c);
  uStack_28 = in_RAX;
  if (0 < iVar1) {
    if ((iVar1 < 0x80) && (*(uchar *)((long)data + 8) == b)) {
      *(int *)((long)data + 0x8c) = iVar1 + 1;
      return;
    }
    uStack_28._0_7_ = (undefined7)in_RAX;
    uStack_28 = CONCAT17('\x01' - (char)iVar1,(undefined7)uStack_28);
    write85(this,*data,(uchar *)((long)&uStack_28 + 7),1);
    write85(this,*data,(uchar *)((long)data + 8),1);
    *(undefined4 *)((long)data + 0x8c) = 0;
  }
  iVar1 = *(int *)((long)data + 0x88);
  if (((iVar1 < 2) || (*(uchar *)((long)data + (ulong)(iVar1 - 1) + 8) != b)) ||
     (((uchar *)((long)data + 8))[iVar1 - 2] != b)) {
    if (0x7f < iVar1) {
      uStack_28 = CONCAT17((char)iVar1 + -1,(undefined7)uStack_28);
      write85(this,*data,(uchar *)((long)&uStack_28 + 7),1);
      write85(this,*data,(uchar *)((long)data + 8),*(int *)((long)data + 0x88));
      *(undefined4 *)((long)data + 0x88) = 0;
    }
    iVar1 = *(int *)((long)data + 0x88);
    *(int *)((long)data + 0x88) = iVar1 + 1;
    *(uchar *)((long)data + (long)iVar1 + 8) = b;
  }
  else {
    if (iVar1 != 2) {
      uStack_28 = CONCAT17((char)iVar1 + -3,(undefined7)uStack_28);
      write85(this,*data,(uchar *)((long)&uStack_28 + 7),1);
      write85(this,*data,(uchar *)((long)data + 8),*(int *)((long)data + 0x88) + -2);
    }
    *(uchar *)((long)data + 8) = b;
    *(undefined8 *)((long)data + 0x88) = 0x300000000;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::write_rle85(uchar b, void *data) // sends one input byte to RLE+ASCII85 encoding
{
  struct_rle85 *rle = (struct_rle85 *)data;
  uchar c;
  if (rle->run_length > 0) { // if within a run
    if (b == rle->buffer[0] &&  rle->run_length < 128) { // the run can be extended
      rle->run_length++;
      return;
    } else { // output the run
      c = (uchar)(257 - rle->run_length);
      write85(rle->data85, &c, 1); // the run-length info
      write85(rle->data85, rle->buffer, 1); // the byte of the run
      rle->run_length = 0;
    }
  }
  if (rle->count >= 2 && b == rle->buffer[rle->count-1] && b == rle->buffer[rle->count-2]) {
    // about to begin a run
    if (rle->count > 2) { // there is non-run data before the run in the buffer
      c = (uchar)(rle->count-2 - 1);
      write85(rle->data85, &c, 1); // length of non-run data
      write85(rle->data85, rle->buffer, rle->count-2); // non-run data
    }
    rle->run_length = 3;
    rle->buffer[0] = b;
    rle->count = 0;
    return;
  }
  if (rle->count >= 128) { // the non-run buffer is full, output it
    c = (uchar)(rle->count - 1);
    write85(rle->data85, &c, 1); // length of non-run data
    write85(rle->data85, rle->buffer, rle->count); // non-run data
    rle->count = 0;
  }
  rle->buffer[rle->count++] = b; // add byte to end of non-run buffer
}